

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

void ff_sqrt(flexfloat_t *dest,flexfloat_t *a)

{
  double *in_RSI;
  double *in_RDI;
  double dVar1;
  flexfloat_t *in_stack_00000030;
  
  dVar1 = sqrt(*in_RSI);
  *in_RDI = dVar1;
  flexfloat_sanitize(in_stack_00000030);
  return;
}

Assistant:

INLINE void ff_sqrt(flexfloat_t *dest, const flexfloat_t *a) {
    assert((dest->desc.exp_bits == a->desc.exp_bits) && (dest->desc.frac_bits == a->desc.frac_bits));
    dest->value = sqrt(a->value);
    #ifdef FLEXFLOAT_TRACKING
    dest->exact_value = sqrt(a->value);
    if(dest->tracking_fn) (dest->tracking_fn)(dest, dest->tracking_arg);
    #endif
    flexfloat_sanitize(dest);
    #ifdef FLEXFLOAT_STATS
    // TODO STATS
    // if(StatsEnabled) getOpStats(dest->desc)->sqrt += 1;
    #endif
}